

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minireflect.h
# Opt level: O0

void __thiscall
flatbuffers::ToStringVisitor::Named<unsigned_int>(ToStringVisitor *this,uint x,char *name)

{
  string local_40;
  char *local_20;
  char *name_local;
  ToStringVisitor *pTStack_10;
  uint x_local;
  ToStringVisitor *this_local;
  
  local_20 = name;
  name_local._4_4_ = x;
  pTStack_10 = this;
  if (name == (char *)0x0) {
    NumToString<unsigned_int>(&local_40,x);
    std::__cxx11::string::operator+=((string *)&this->s,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    if ((this->q & 1U) != 0) {
      std::__cxx11::string::operator+=((string *)&this->s,"\"");
    }
    std::__cxx11::string::operator+=((string *)&this->s,local_20);
    if ((this->q & 1U) != 0) {
      std::__cxx11::string::operator+=((string *)&this->s,"\"");
    }
  }
  return;
}

Assistant:

void Named(T x, const char *name) {
    if (name) {
      if (q) s += "\"";
      s += name;
      if (q) s += "\"";
    } else {
      s += NumToString(x);
    }
  }